

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_64x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar19;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar20;
  ushort uVar27;
  ushort uVar31;
  ushort uVar35;
  ushort uVar39;
  ushort uVar43;
  ushort uVar47;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  undefined1 auVar26 [16];
  int y_mask_2;
  __m128i scaled_bottom_left_y_1;
  __m128i weights_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  int y_mask;
  __m128i round;
  __m128i scaled_bottom_left4;
  __m128i scaled_bottom_left3;
  __m128i scaled_bottom_left2;
  __m128i scaled_bottom_left1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i scale;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i top8;
  __m128i top7;
  __m128i top6;
  __m128i top5;
  __m128i top_hihi;
  __m128i top_hilo;
  __m128i top4;
  __m128i top3;
  __m128i top2;
  __m128i top1;
  __m128i top_lohi;
  __m128i top_lolo;
  __m128i bottom_left;
  __m128i zero;
  __m128i pred2_15;
  __m128i pred1_15;
  __m128i pred_sum2_15;
  __m128i pred_sum1_15;
  __m128i weighted_px2_15;
  __m128i weighted_px1_15;
  __m128i pred2_14;
  __m128i pred1_14;
  __m128i pred_sum2_14;
  __m128i pred_sum1_14;
  __m128i weighted_px2_14;
  __m128i weighted_px1_14;
  __m128i pred2_13;
  __m128i pred1_13;
  __m128i pred_sum2_13;
  __m128i pred_sum1_13;
  __m128i weighted_px2_13;
  __m128i weighted_px1_13;
  __m128i pred2_12;
  __m128i pred1_12;
  __m128i pred_sum2_12;
  __m128i pred_sum1_12;
  __m128i weighted_px2_12;
  __m128i weighted_px1_12;
  __m128i pred2_11;
  __m128i pred1_11;
  __m128i pred_sum2_11;
  __m128i pred_sum1_11;
  __m128i weighted_px2_11;
  __m128i weighted_px1_11;
  __m128i pred2_10;
  __m128i pred1_10;
  __m128i pred_sum2_10;
  __m128i pred_sum1_10;
  __m128i weighted_px2_10;
  __m128i weighted_px1_10;
  __m128i pred2_9;
  __m128i pred1_9;
  __m128i pred_sum2_9;
  __m128i pred_sum1_9;
  __m128i weighted_px2_9;
  __m128i weighted_px1_9;
  __m128i pred2_8;
  __m128i pred1_8;
  __m128i pred_sum2_8;
  __m128i pred_sum1_8;
  __m128i weighted_px2_8;
  __m128i weighted_px1_8;
  __m128i pred2_7;
  __m128i pred1_7;
  __m128i pred_sum2_7;
  __m128i pred_sum1_7;
  __m128i weighted_px2_7;
  __m128i weighted_px1_7;
  __m128i pred2_6;
  __m128i pred1_6;
  __m128i pred_sum2_6;
  __m128i pred_sum1_6;
  __m128i weighted_px2_6;
  __m128i weighted_px1_6;
  __m128i pred2_5;
  __m128i pred1_5;
  __m128i pred_sum2_5;
  __m128i pred_sum1_5;
  __m128i weighted_px2_5;
  __m128i weighted_px1_5;
  __m128i pred2_4;
  __m128i pred1_4;
  __m128i pred_sum2_4;
  __m128i pred_sum1_4;
  __m128i weighted_px2_4;
  __m128i weighted_px1_4;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_2c6c;
  int local_2c2c;
  int local_2bec;
  int local_2bac;
  undefined8 *local_29b0;
  byte bStack_2830;
  byte bStack_282f;
  byte bStack_282e;
  byte bStack_282d;
  byte bStack_282c;
  byte bStack_282b;
  byte bStack_282a;
  byte bStack_2829;
  byte bStack_2810;
  byte bStack_280f;
  byte bStack_280e;
  byte bStack_280d;
  byte bStack_280c;
  byte bStack_280b;
  byte bStack_280a;
  byte bStack_2809;
  byte bStack_27f0;
  byte bStack_27ef;
  byte bStack_27ee;
  byte bStack_27ed;
  byte bStack_27ec;
  byte bStack_27eb;
  byte bStack_27ea;
  byte bStack_27e9;
  byte bStack_27d0;
  byte bStack_27cf;
  byte bStack_27ce;
  byte bStack_27cd;
  byte bStack_27cc;
  byte bStack_27cb;
  byte bStack_27ca;
  byte bStack_27c9;
  byte local_2718;
  byte bStack_2717;
  byte bStack_2716;
  byte bStack_2715;
  byte bStack_2714;
  byte bStack_2713;
  byte bStack_2712;
  byte bStack_2711;
  byte local_26d8;
  byte bStack_26d7;
  byte bStack_26d6;
  byte bStack_26d5;
  byte bStack_26d4;
  byte bStack_26d3;
  byte bStack_26d2;
  byte bStack_26d1;
  byte local_2698;
  byte bStack_2697;
  byte bStack_2696;
  byte bStack_2695;
  byte bStack_2694;
  byte bStack_2693;
  byte bStack_2692;
  byte bStack_2691;
  byte local_2658;
  byte bStack_2657;
  byte bStack_2656;
  byte bStack_2655;
  byte bStack_2654;
  byte bStack_2653;
  byte bStack_2652;
  byte bStack_2651;
  ushort uStack_25c2;
  ushort uStack_25ba;
  ushort uStack_25a2;
  ushort uStack_259a;
  ushort uStack_2582;
  ushort uStack_257a;
  ushort uStack_2566;
  ushort uStack_2564;
  ushort uStack_2562;
  ushort uStack_255e;
  ushort uStack_255c;
  ushort uStack_255a;
  ushort uStack_2376;
  ushort uStack_2374;
  ushort uStack_2372;
  ushort uStack_236e;
  ushort uStack_236c;
  ushort uStack_236a;
  ushort uStack_2356;
  ushort uStack_2354;
  ushort uStack_2352;
  ushort uStack_234e;
  ushort uStack_234c;
  ushort uStack_234a;
  ushort uStack_21b6;
  ushort uStack_21b4;
  ushort uStack_21b2;
  ushort uStack_21ae;
  ushort uStack_21ac;
  ushort uStack_21aa;
  ushort uStack_2196;
  ushort uStack_2194;
  ushort uStack_2192;
  ushort uStack_218e;
  ushort uStack_218c;
  ushort uStack_218a;
  ushort uStack_1ff6;
  ushort uStack_1ff4;
  ushort uStack_1ff2;
  ushort uStack_1fee;
  ushort uStack_1fec;
  ushort uStack_1fea;
  ushort uStack_1fd6;
  ushort uStack_1fd4;
  ushort uStack_1fd2;
  ushort uStack_1fce;
  ushort uStack_1fcc;
  ushort uStack_1fca;
  short local_1e58;
  short sStack_1e56;
  short sStack_1e54;
  short sStack_1e52;
  short sStack_1e50;
  short sStack_1e4e;
  short sStack_1e4c;
  short sStack_1e4a;
  ushort uStack_1e36;
  ushort uStack_1e34;
  ushort uStack_1e32;
  ushort uStack_1e2e;
  ushort uStack_1e2c;
  ushort uStack_1e2a;
  short local_1e28;
  short sStack_1e26;
  short sStack_1e24;
  short sStack_1e22;
  short sStack_1e20;
  short sStack_1e1e;
  short sStack_1e1c;
  short sStack_1e1a;
  ushort uStack_1e16;
  ushort uStack_1e14;
  ushort uStack_1e12;
  ushort uStack_1e0e;
  ushort uStack_1e0c;
  ushort uStack_1e0a;
  ushort uStack_1c76;
  ushort uStack_1c74;
  ushort uStack_1c72;
  ushort uStack_1c6e;
  ushort uStack_1c6c;
  ushort uStack_1c6a;
  ushort uStack_1c56;
  ushort uStack_1c54;
  ushort uStack_1c52;
  ushort uStack_1c4e;
  ushort uStack_1c4c;
  ushort uStack_1c4a;
  ushort uStack_1ab6;
  ushort uStack_1ab4;
  ushort uStack_1ab2;
  ushort uStack_1aae;
  ushort uStack_1aac;
  ushort uStack_1aaa;
  ushort uStack_1a96;
  ushort uStack_1a94;
  ushort uStack_1a92;
  ushort uStack_1a8e;
  ushort uStack_1a8c;
  ushort uStack_1a8a;
  ushort uStack_18f6;
  ushort uStack_18f4;
  ushort uStack_18f2;
  ushort uStack_18ee;
  ushort uStack_18ec;
  ushort uStack_18ea;
  ushort uStack_18d6;
  ushort uStack_18d4;
  ushort uStack_18d2;
  ushort uStack_18ce;
  ushort uStack_18cc;
  ushort uStack_18ca;
  short local_1758;
  short sStack_1756;
  short sStack_1754;
  short sStack_1752;
  short sStack_1750;
  short sStack_174e;
  short sStack_174c;
  short sStack_174a;
  ushort uStack_1736;
  ushort uStack_1734;
  ushort uStack_1732;
  ushort uStack_172e;
  ushort uStack_172c;
  ushort uStack_172a;
  short local_1728;
  short sStack_1726;
  short sStack_1724;
  short sStack_1722;
  short sStack_1720;
  short sStack_171e;
  short sStack_171c;
  short sStack_171a;
  ushort uStack_1716;
  ushort uStack_1714;
  ushort uStack_1712;
  ushort uStack_170e;
  ushort uStack_170c;
  ushort uStack_170a;
  ushort uStack_1576;
  ushort uStack_1574;
  ushort uStack_1572;
  ushort uStack_156e;
  ushort uStack_156c;
  ushort uStack_156a;
  ushort uStack_1556;
  ushort uStack_1554;
  ushort uStack_1552;
  ushort uStack_154e;
  ushort uStack_154c;
  ushort uStack_154a;
  ushort uStack_13b6;
  ushort uStack_13b4;
  ushort uStack_13b2;
  ushort uStack_13ae;
  ushort uStack_13ac;
  ushort uStack_13aa;
  ushort uStack_1396;
  ushort uStack_1394;
  ushort uStack_1392;
  ushort uStack_138e;
  ushort uStack_138c;
  ushort uStack_138a;
  ushort uStack_11f6;
  ushort uStack_11f4;
  ushort uStack_11f2;
  ushort uStack_11ee;
  ushort uStack_11ec;
  ushort uStack_11ea;
  ushort uStack_11d6;
  ushort uStack_11d4;
  ushort uStack_11d2;
  ushort uStack_11ce;
  ushort uStack_11cc;
  ushort uStack_11ca;
  short local_1058;
  short sStack_1056;
  short sStack_1054;
  short sStack_1052;
  short sStack_1050;
  short sStack_104e;
  short sStack_104c;
  short sStack_104a;
  ushort uStack_1036;
  ushort uStack_1034;
  ushort uStack_1032;
  ushort uStack_102e;
  ushort uStack_102c;
  ushort uStack_102a;
  short local_1028;
  short sStack_1026;
  short sStack_1024;
  short sStack_1022;
  short sStack_1020;
  short sStack_101e;
  short sStack_101c;
  short sStack_101a;
  ushort uStack_1016;
  ushort uStack_1014;
  ushort uStack_1012;
  ushort uStack_100e;
  ushort uStack_100c;
  ushort uStack_100a;
  ushort uStack_e76;
  ushort uStack_e74;
  ushort uStack_e72;
  ushort uStack_e6e;
  ushort uStack_e6c;
  ushort uStack_e6a;
  ushort uStack_e56;
  ushort uStack_e54;
  ushort uStack_e52;
  ushort uStack_e4e;
  ushort uStack_e4c;
  ushort uStack_e4a;
  ushort uStack_cb6;
  ushort uStack_cb4;
  ushort uStack_cb2;
  ushort uStack_cae;
  ushort uStack_cac;
  ushort uStack_caa;
  ushort uStack_c96;
  ushort uStack_c94;
  ushort uStack_c92;
  ushort uStack_c8e;
  ushort uStack_c8c;
  ushort uStack_c8a;
  ushort uStack_af6;
  ushort uStack_af4;
  ushort uStack_af2;
  ushort uStack_aee;
  ushort uStack_aec;
  ushort uStack_aea;
  ushort uStack_ad6;
  ushort uStack_ad4;
  ushort uStack_ad2;
  ushort uStack_ace;
  ushort uStack_acc;
  ushort uStack_aca;
  short local_958;
  short sStack_956;
  short sStack_954;
  short sStack_952;
  short sStack_950;
  short sStack_94e;
  short sStack_94c;
  short sStack_94a;
  ushort uStack_936;
  ushort uStack_934;
  ushort uStack_932;
  ushort uStack_92e;
  ushort uStack_92c;
  ushort uStack_92a;
  short local_928;
  short sStack_926;
  short sStack_924;
  short sStack_922;
  short sStack_920;
  short sStack_91e;
  short sStack_91c;
  short sStack_91a;
  ushort uStack_916;
  ushort uStack_914;
  ushort uStack_912;
  ushort uStack_90e;
  ushort uStack_90c;
  ushort uStack_90a;
  __m128i scaled_bottom_left_y_3;
  __m128i weights_y_3;
  __m128i y_select_3;
  int y_mask_3;
  __m128i scaled_bottom_left_y_2;
  __m128i weights_y_2;
  __m128i y_select_2;
  
  bVar1 = *(byte *)(in_RCX + 0x1f);
  uVar19 = CONCAT11(0,bVar1);
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar5 = in_RDX[3];
  local_2658 = (byte)uVar2;
  bStack_2657 = (byte)((ulong)uVar2 >> 8);
  bStack_2656 = (byte)((ulong)uVar2 >> 0x10);
  bStack_2655 = (byte)((ulong)uVar2 >> 0x18);
  bStack_2654 = (byte)((ulong)uVar2 >> 0x20);
  bStack_2653 = (byte)((ulong)uVar2 >> 0x28);
  bStack_2652 = (byte)((ulong)uVar2 >> 0x30);
  bStack_2651 = (byte)((ulong)uVar2 >> 0x38);
  bStack_27d0 = (byte)uVar3;
  bStack_27cf = (byte)((ulong)uVar3 >> 8);
  bStack_27ce = (byte)((ulong)uVar3 >> 0x10);
  bStack_27cd = (byte)((ulong)uVar3 >> 0x18);
  bStack_27cc = (byte)((ulong)uVar3 >> 0x20);
  bStack_27cb = (byte)((ulong)uVar3 >> 0x28);
  bStack_27ca = (byte)((ulong)uVar3 >> 0x30);
  bStack_27c9 = (byte)((ulong)uVar3 >> 0x38);
  local_2698 = (byte)uVar4;
  bStack_2697 = (byte)((ulong)uVar4 >> 8);
  bStack_2696 = (byte)((ulong)uVar4 >> 0x10);
  bStack_2695 = (byte)((ulong)uVar4 >> 0x18);
  bStack_2694 = (byte)((ulong)uVar4 >> 0x20);
  bStack_2693 = (byte)((ulong)uVar4 >> 0x28);
  bStack_2692 = (byte)((ulong)uVar4 >> 0x30);
  bStack_2691 = (byte)((ulong)uVar4 >> 0x38);
  bStack_27f0 = (byte)uVar5;
  bStack_27ef = (byte)((ulong)uVar5 >> 8);
  bStack_27ee = (byte)((ulong)uVar5 >> 0x10);
  bStack_27ed = (byte)((ulong)uVar5 >> 0x18);
  bStack_27ec = (byte)((ulong)uVar5 >> 0x20);
  bStack_27eb = (byte)((ulong)uVar5 >> 0x28);
  bStack_27ea = (byte)((ulong)uVar5 >> 0x30);
  bStack_27e9 = (byte)((ulong)uVar5 >> 0x38);
  uVar2 = in_RDX[4];
  uVar3 = in_RDX[5];
  uVar4 = in_RDX[6];
  uVar5 = in_RDX[7];
  local_26d8 = (byte)uVar2;
  bStack_26d7 = (byte)((ulong)uVar2 >> 8);
  bStack_26d6 = (byte)((ulong)uVar2 >> 0x10);
  bStack_26d5 = (byte)((ulong)uVar2 >> 0x18);
  bStack_26d4 = (byte)((ulong)uVar2 >> 0x20);
  bStack_26d3 = (byte)((ulong)uVar2 >> 0x28);
  bStack_26d2 = (byte)((ulong)uVar2 >> 0x30);
  bStack_26d1 = (byte)((ulong)uVar2 >> 0x38);
  bStack_2810 = (byte)uVar3;
  bStack_280f = (byte)((ulong)uVar3 >> 8);
  bStack_280e = (byte)((ulong)uVar3 >> 0x10);
  bStack_280d = (byte)((ulong)uVar3 >> 0x18);
  bStack_280c = (byte)((ulong)uVar3 >> 0x20);
  bStack_280b = (byte)((ulong)uVar3 >> 0x28);
  bStack_280a = (byte)((ulong)uVar3 >> 0x30);
  bStack_2809 = (byte)((ulong)uVar3 >> 0x38);
  local_2718 = (byte)uVar4;
  bStack_2717 = (byte)((ulong)uVar4 >> 8);
  bStack_2716 = (byte)((ulong)uVar4 >> 0x10);
  bStack_2715 = (byte)((ulong)uVar4 >> 0x18);
  bStack_2714 = (byte)((ulong)uVar4 >> 0x20);
  bStack_2713 = (byte)((ulong)uVar4 >> 0x28);
  bStack_2712 = (byte)((ulong)uVar4 >> 0x30);
  bStack_2711 = (byte)((ulong)uVar4 >> 0x38);
  bStack_2830 = (byte)uVar5;
  bStack_282f = (byte)((ulong)uVar5 >> 8);
  bStack_282e = (byte)((ulong)uVar5 >> 0x10);
  bStack_282d = (byte)((ulong)uVar5 >> 0x18);
  bStack_282c = (byte)((ulong)uVar5 >> 0x20);
  bStack_282b = (byte)((ulong)uVar5 >> 0x28);
  bStack_282a = (byte)((ulong)uVar5 >> 0x30);
  bStack_2829 = (byte)((ulong)uVar5 >> 0x38);
  uStack_2566 = (ushort)bVar1;
  uStack_2564 = (ushort)bVar1;
  uStack_2562 = (ushort)bVar1;
  uStack_255e = (ushort)bVar1;
  uStack_255c = (ushort)bVar1;
  uStack_255a = (ushort)bVar1;
  uStack_2582 = (ushort)bVar1;
  uStack_257a = (ushort)bVar1;
  uStack_25a2 = (ushort)bVar1;
  uStack_259a = (ushort)bVar1;
  uStack_25c2 = (ushort)bVar1;
  uStack_25ba = (ushort)bVar1;
  local_29b0 = in_RDI;
  for (local_2bac = 0x1000100; local_2bac < 0xf0e0f0f; local_2bac = local_2bac + 0x2020202) {
    auVar18._8_7_ = 0x9d00a900b600c4;
    auVar18._0_8_ = 0xd200e100f000ff;
    auVar18[0xf] = 0;
    auVar17._8_8_ = CONCAT44(local_2bac,local_2bac);
    auVar17._0_8_ = CONCAT44(local_2bac,local_2bac);
    auVar24 = pshufb(auVar18,auVar17);
    auVar16._2_2_ = uStack_2566 * 0x10;
    auVar16._0_2_ = uVar19;
    auVar16._4_2_ = uStack_2564 * 0x1f;
    auVar16._6_2_ = uStack_2562 * 0x2e;
    auVar16._10_2_ = uStack_255e * 0x4a;
    auVar16._8_2_ = uVar19 * 0x3c;
    auVar16._12_2_ = uStack_255c * 0x57;
    auVar16._14_2_ = uStack_255a * 99;
    auVar15._8_8_ = CONCAT44(local_2bac,local_2bac);
    auVar15._0_8_ = CONCAT44(local_2bac,local_2bac);
    auVar25 = pshufb(auVar16,auVar15);
    uStack_916 = (ushort)bStack_2657;
    uStack_914 = (ushort)bStack_2656;
    uStack_912 = (ushort)bStack_2655;
    uStack_90e = (ushort)bStack_2653;
    uStack_90c = (ushort)bStack_2652;
    uStack_90a = (ushort)bStack_2651;
    local_928 = auVar24._0_2_;
    sStack_926 = auVar24._2_2_;
    sStack_924 = auVar24._4_2_;
    sStack_922 = auVar24._6_2_;
    sStack_920 = auVar24._8_2_;
    sStack_91e = auVar24._10_2_;
    sStack_91c = auVar24._12_2_;
    sStack_91a = auVar24._14_2_;
    uStack_936 = (ushort)bStack_27cf;
    uStack_934 = (ushort)bStack_27ce;
    uStack_932 = (ushort)bStack_27cd;
    uStack_92e = (ushort)bStack_27cb;
    uStack_92c = (ushort)bStack_27ca;
    uStack_92a = (ushort)bStack_27c9;
    local_958 = auVar25._0_2_;
    sStack_956 = auVar25._2_2_;
    sStack_954 = auVar25._4_2_;
    sStack_952 = auVar25._6_2_;
    sStack_950 = auVar25._8_2_;
    sStack_94e = auVar25._10_2_;
    sStack_94c = auVar25._12_2_;
    sStack_94a = auVar25._14_2_;
    uVar20 = local_958 + (ushort)local_2658 * local_928 + 0x80;
    uVar27 = sStack_956 + uStack_916 * sStack_926 + 0x80;
    uVar31 = sStack_954 + uStack_914 * sStack_924 + 0x80;
    uVar35 = sStack_952 + uStack_912 * sStack_922 + 0x80;
    uVar39 = sStack_950 + (ushort)bStack_2654 * sStack_920 + 0x80;
    uVar43 = sStack_94e + uStack_90e * sStack_91e + 0x80;
    uVar47 = sStack_94c + uStack_90c * sStack_91c + 0x80;
    uVar51 = sStack_94a + uStack_90a * sStack_91a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_958 + (ushort)bStack_27d0 * local_928 + 0x80;
    uVar29 = sStack_956 + uStack_936 * sStack_926 + 0x80;
    uVar33 = sStack_954 + uStack_934 * sStack_924 + 0x80;
    uVar37 = sStack_952 + uStack_932 * sStack_922 + 0x80;
    uVar41 = sStack_950 + (ushort)bStack_27cc * sStack_920 + 0x80;
    uVar45 = sStack_94e + uStack_92e * sStack_91e + 0x80;
    uVar49 = sStack_94c + uStack_92c * sStack_91c + 0x80;
    uVar53 = sStack_94a + uStack_92a * sStack_91a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    *local_29b0 = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                           CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                    (0xff < uVar48),
                                    CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8)
                                             - (0xff < uVar44),
                                             CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                      (char)(uVar39 >> 8) - (0xff < uVar40),
                                                      CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT12((uVar32 != 0) *
                                                                         (uVar32 < 0x100) *
                                                                         (char)(uVar31 >> 8) -
                                                                         (0xff < uVar32),
                                                                         CONCAT11((uVar28 != 0) *
                                                                                  (uVar28 < 0x100) *
                                                                                  (char)(uVar27 >> 8
                                                                                        ) - (0xff < 
                                                  uVar28),(uVar21 != 0) * (uVar21 < 0x100) *
                                                          (char)(uVar20 >> 8) - (0xff < uVar21))))))
                                   ));
    local_29b0[1] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_ad6 = (ushort)bStack_2697;
    uStack_ad4 = (ushort)bStack_2696;
    uStack_ad2 = (ushort)bStack_2695;
    uStack_ace = (ushort)bStack_2693;
    uStack_acc = (ushort)bStack_2692;
    uStack_aca = (ushort)bStack_2691;
    uStack_af6 = (ushort)bStack_27ef;
    uStack_af4 = (ushort)bStack_27ee;
    uStack_af2 = (ushort)bStack_27ed;
    uStack_aee = (ushort)bStack_27eb;
    uStack_aec = (ushort)bStack_27ea;
    uStack_aea = (ushort)bStack_27e9;
    uVar20 = local_958 + (ushort)local_2698 * local_928 + 0x80;
    uVar27 = sStack_956 + uStack_ad6 * sStack_926 + 0x80;
    uVar31 = sStack_954 + uStack_ad4 * sStack_924 + 0x80;
    uVar35 = sStack_952 + uStack_ad2 * sStack_922 + 0x80;
    uVar39 = sStack_950 + (ushort)bStack_2694 * sStack_920 + 0x80;
    uVar43 = sStack_94e + uStack_ace * sStack_91e + 0x80;
    uVar47 = sStack_94c + uStack_acc * sStack_91c + 0x80;
    uVar51 = sStack_94a + uStack_aca * sStack_91a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_958 + (ushort)bStack_27f0 * local_928 + 0x80;
    uVar29 = sStack_956 + uStack_af6 * sStack_926 + 0x80;
    uVar33 = sStack_954 + uStack_af4 * sStack_924 + 0x80;
    uVar37 = sStack_952 + uStack_af2 * sStack_922 + 0x80;
    uVar41 = sStack_950 + (ushort)bStack_27ec * sStack_920 + 0x80;
    uVar45 = sStack_94e + uStack_aee * sStack_91e + 0x80;
    uVar49 = sStack_94c + uStack_aec * sStack_91c + 0x80;
    uVar53 = sStack_94a + uStack_aea * sStack_91a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[2] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[3] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_c96 = (ushort)bStack_26d7;
    uStack_c94 = (ushort)bStack_26d6;
    uStack_c92 = (ushort)bStack_26d5;
    uStack_c8e = (ushort)bStack_26d3;
    uStack_c8c = (ushort)bStack_26d2;
    uStack_c8a = (ushort)bStack_26d1;
    uStack_cb6 = (ushort)bStack_280f;
    uStack_cb4 = (ushort)bStack_280e;
    uStack_cb2 = (ushort)bStack_280d;
    uStack_cae = (ushort)bStack_280b;
    uStack_cac = (ushort)bStack_280a;
    uStack_caa = (ushort)bStack_2809;
    uVar20 = local_958 + (ushort)local_26d8 * local_928 + 0x80;
    uVar27 = sStack_956 + uStack_c96 * sStack_926 + 0x80;
    uVar31 = sStack_954 + uStack_c94 * sStack_924 + 0x80;
    uVar35 = sStack_952 + uStack_c92 * sStack_922 + 0x80;
    uVar39 = sStack_950 + (ushort)bStack_26d4 * sStack_920 + 0x80;
    uVar43 = sStack_94e + uStack_c8e * sStack_91e + 0x80;
    uVar47 = sStack_94c + uStack_c8c * sStack_91c + 0x80;
    uVar51 = sStack_94a + uStack_c8a * sStack_91a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_958 + (ushort)bStack_2810 * local_928 + 0x80;
    uVar29 = sStack_956 + uStack_cb6 * sStack_926 + 0x80;
    uVar33 = sStack_954 + uStack_cb4 * sStack_924 + 0x80;
    uVar37 = sStack_952 + uStack_cb2 * sStack_922 + 0x80;
    uVar41 = sStack_950 + (ushort)bStack_280c * sStack_920 + 0x80;
    uVar45 = sStack_94e + uStack_cae * sStack_91e + 0x80;
    uVar49 = sStack_94c + uStack_cac * sStack_91c + 0x80;
    uVar53 = sStack_94a + uStack_caa * sStack_91a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[4] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[5] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_e56 = (ushort)bStack_2717;
    uStack_e54 = (ushort)bStack_2716;
    uStack_e52 = (ushort)bStack_2715;
    uStack_e4e = (ushort)bStack_2713;
    uStack_e4c = (ushort)bStack_2712;
    uStack_e4a = (ushort)bStack_2711;
    uStack_e76 = (ushort)bStack_282f;
    uStack_e74 = (ushort)bStack_282e;
    uStack_e72 = (ushort)bStack_282d;
    uStack_e6e = (ushort)bStack_282b;
    uStack_e6c = (ushort)bStack_282a;
    uStack_e6a = (ushort)bStack_2829;
    uVar20 = local_958 + (ushort)local_2718 * local_928 + 0x80;
    uVar27 = sStack_956 + uStack_e56 * sStack_926 + 0x80;
    uVar31 = sStack_954 + uStack_e54 * sStack_924 + 0x80;
    uVar35 = sStack_952 + uStack_e52 * sStack_922 + 0x80;
    uVar39 = sStack_950 + (ushort)bStack_2714 * sStack_920 + 0x80;
    uVar43 = sStack_94e + uStack_e4e * sStack_91e + 0x80;
    uVar47 = sStack_94c + uStack_e4c * sStack_91c + 0x80;
    uVar51 = sStack_94a + uStack_e4a * sStack_91a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_958 + (ushort)bStack_2830 * local_928 + 0x80;
    uVar29 = sStack_956 + uStack_e76 * sStack_926 + 0x80;
    uVar33 = sStack_954 + uStack_e74 * sStack_924 + 0x80;
    uVar37 = sStack_952 + uStack_e72 * sStack_922 + 0x80;
    uVar41 = sStack_950 + (ushort)bStack_282c * sStack_920 + 0x80;
    uVar45 = sStack_94e + uStack_e6e * sStack_91e + 0x80;
    uVar49 = sStack_94c + uStack_e6c * sStack_91c + 0x80;
    uVar53 = sStack_94a + uStack_e6a * sStack_91a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[6] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[7] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    local_29b0 = (undefined8 *)(in_RSI + (long)local_29b0);
  }
  for (local_2bec = 0x1000100; local_2bec < 0xf0e0f0f; local_2bec = local_2bec + 0x2020202) {
    auVar14._8_7_ = 0x4a0053005c0065;
    auVar14._0_8_ = 0x6f007a00850091;
    auVar14[0xf] = 0;
    auVar13._8_8_ = CONCAT44(local_2bec,local_2bec);
    auVar13._0_8_ = CONCAT44(local_2bec,local_2bec);
    auVar24 = pshufb(auVar14,auVar13);
    auVar12._2_2_ = uStack_2566 * 0x7b;
    auVar12._0_2_ = uVar19 * 0x6f;
    auVar12._4_2_ = uStack_2564 * 0x86;
    auVar12._6_2_ = uStack_2582 * 0x91;
    auVar12._10_2_ = uStack_255e * 0xa4;
    auVar12._8_2_ = uVar19 * 0x9b;
    auVar12._12_2_ = uStack_255c * 0xad;
    auVar12._14_2_ = uStack_257a * 0xb6;
    auVar11._8_8_ = CONCAT44(local_2bec,local_2bec);
    auVar11._0_8_ = CONCAT44(local_2bec,local_2bec);
    auVar25 = pshufb(auVar12,auVar11);
    uStack_1016 = (ushort)bStack_2657;
    uStack_1014 = (ushort)bStack_2656;
    uStack_1012 = (ushort)bStack_2655;
    uStack_100e = (ushort)bStack_2653;
    uStack_100c = (ushort)bStack_2652;
    uStack_100a = (ushort)bStack_2651;
    local_1028 = auVar24._0_2_;
    sStack_1026 = auVar24._2_2_;
    sStack_1024 = auVar24._4_2_;
    sStack_1022 = auVar24._6_2_;
    sStack_1020 = auVar24._8_2_;
    sStack_101e = auVar24._10_2_;
    sStack_101c = auVar24._12_2_;
    sStack_101a = auVar24._14_2_;
    uStack_1036 = (ushort)bStack_27cf;
    uStack_1034 = (ushort)bStack_27ce;
    uStack_1032 = (ushort)bStack_27cd;
    uStack_102e = (ushort)bStack_27cb;
    uStack_102c = (ushort)bStack_27ca;
    uStack_102a = (ushort)bStack_27c9;
    local_1058 = auVar25._0_2_;
    sStack_1056 = auVar25._2_2_;
    sStack_1054 = auVar25._4_2_;
    sStack_1052 = auVar25._6_2_;
    sStack_1050 = auVar25._8_2_;
    sStack_104e = auVar25._10_2_;
    sStack_104c = auVar25._12_2_;
    sStack_104a = auVar25._14_2_;
    uVar20 = local_1058 + (ushort)local_2658 * local_1028 + 0x80;
    uVar27 = sStack_1056 + uStack_1016 * sStack_1026 + 0x80;
    uVar31 = sStack_1054 + uStack_1014 * sStack_1024 + 0x80;
    uVar35 = sStack_1052 + uStack_1012 * sStack_1022 + 0x80;
    uVar39 = sStack_1050 + (ushort)bStack_2654 * sStack_1020 + 0x80;
    uVar43 = sStack_104e + uStack_100e * sStack_101e + 0x80;
    uVar47 = sStack_104c + uStack_100c * sStack_101c + 0x80;
    uVar51 = sStack_104a + uStack_100a * sStack_101a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1058 + (ushort)bStack_27d0 * local_1028 + 0x80;
    uVar29 = sStack_1056 + uStack_1036 * sStack_1026 + 0x80;
    uVar33 = sStack_1054 + uStack_1034 * sStack_1024 + 0x80;
    uVar37 = sStack_1052 + uStack_1032 * sStack_1022 + 0x80;
    uVar41 = sStack_1050 + (ushort)bStack_27cc * sStack_1020 + 0x80;
    uVar45 = sStack_104e + uStack_102e * sStack_101e + 0x80;
    uVar49 = sStack_104c + uStack_102c * sStack_101c + 0x80;
    uVar53 = sStack_104a + uStack_102a * sStack_101a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    *local_29b0 = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                           CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                    (0xff < uVar48),
                                    CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8)
                                             - (0xff < uVar44),
                                             CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                      (char)(uVar39 >> 8) - (0xff < uVar40),
                                                      CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT12((uVar32 != 0) *
                                                                         (uVar32 < 0x100) *
                                                                         (char)(uVar31 >> 8) -
                                                                         (0xff < uVar32),
                                                                         CONCAT11((uVar28 != 0) *
                                                                                  (uVar28 < 0x100) *
                                                                                  (char)(uVar27 >> 8
                                                                                        ) - (0xff < 
                                                  uVar28),(uVar21 != 0) * (uVar21 < 0x100) *
                                                          (char)(uVar20 >> 8) - (0xff < uVar21))))))
                                   ));
    local_29b0[1] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_11d6 = (ushort)bStack_2697;
    uStack_11d4 = (ushort)bStack_2696;
    uStack_11d2 = (ushort)bStack_2695;
    uStack_11ce = (ushort)bStack_2693;
    uStack_11cc = (ushort)bStack_2692;
    uStack_11ca = (ushort)bStack_2691;
    uStack_11f6 = (ushort)bStack_27ef;
    uStack_11f4 = (ushort)bStack_27ee;
    uStack_11f2 = (ushort)bStack_27ed;
    uStack_11ee = (ushort)bStack_27eb;
    uStack_11ec = (ushort)bStack_27ea;
    uStack_11ea = (ushort)bStack_27e9;
    uVar20 = local_1058 + (ushort)local_2698 * local_1028 + 0x80;
    uVar27 = sStack_1056 + uStack_11d6 * sStack_1026 + 0x80;
    uVar31 = sStack_1054 + uStack_11d4 * sStack_1024 + 0x80;
    uVar35 = sStack_1052 + uStack_11d2 * sStack_1022 + 0x80;
    uVar39 = sStack_1050 + (ushort)bStack_2694 * sStack_1020 + 0x80;
    uVar43 = sStack_104e + uStack_11ce * sStack_101e + 0x80;
    uVar47 = sStack_104c + uStack_11cc * sStack_101c + 0x80;
    uVar51 = sStack_104a + uStack_11ca * sStack_101a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1058 + (ushort)bStack_27f0 * local_1028 + 0x80;
    uVar29 = sStack_1056 + uStack_11f6 * sStack_1026 + 0x80;
    uVar33 = sStack_1054 + uStack_11f4 * sStack_1024 + 0x80;
    uVar37 = sStack_1052 + uStack_11f2 * sStack_1022 + 0x80;
    uVar41 = sStack_1050 + (ushort)bStack_27ec * sStack_1020 + 0x80;
    uVar45 = sStack_104e + uStack_11ee * sStack_101e + 0x80;
    uVar49 = sStack_104c + uStack_11ec * sStack_101c + 0x80;
    uVar53 = sStack_104a + uStack_11ea * sStack_101a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[2] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[3] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_1396 = (ushort)bStack_26d7;
    uStack_1394 = (ushort)bStack_26d6;
    uStack_1392 = (ushort)bStack_26d5;
    uStack_138e = (ushort)bStack_26d3;
    uStack_138c = (ushort)bStack_26d2;
    uStack_138a = (ushort)bStack_26d1;
    uStack_13b6 = (ushort)bStack_280f;
    uStack_13b4 = (ushort)bStack_280e;
    uStack_13b2 = (ushort)bStack_280d;
    uStack_13ae = (ushort)bStack_280b;
    uStack_13ac = (ushort)bStack_280a;
    uStack_13aa = (ushort)bStack_2809;
    uVar20 = local_1058 + (ushort)local_26d8 * local_1028 + 0x80;
    uVar27 = sStack_1056 + uStack_1396 * sStack_1026 + 0x80;
    uVar31 = sStack_1054 + uStack_1394 * sStack_1024 + 0x80;
    uVar35 = sStack_1052 + uStack_1392 * sStack_1022 + 0x80;
    uVar39 = sStack_1050 + (ushort)bStack_26d4 * sStack_1020 + 0x80;
    uVar43 = sStack_104e + uStack_138e * sStack_101e + 0x80;
    uVar47 = sStack_104c + uStack_138c * sStack_101c + 0x80;
    uVar51 = sStack_104a + uStack_138a * sStack_101a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1058 + (ushort)bStack_2810 * local_1028 + 0x80;
    uVar29 = sStack_1056 + uStack_13b6 * sStack_1026 + 0x80;
    uVar33 = sStack_1054 + uStack_13b4 * sStack_1024 + 0x80;
    uVar37 = sStack_1052 + uStack_13b2 * sStack_1022 + 0x80;
    uVar41 = sStack_1050 + (ushort)bStack_280c * sStack_1020 + 0x80;
    uVar45 = sStack_104e + uStack_13ae * sStack_101e + 0x80;
    uVar49 = sStack_104c + uStack_13ac * sStack_101c + 0x80;
    uVar53 = sStack_104a + uStack_13aa * sStack_101a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[4] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[5] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_1556 = (ushort)bStack_2717;
    uStack_1554 = (ushort)bStack_2716;
    uStack_1552 = (ushort)bStack_2715;
    uStack_154e = (ushort)bStack_2713;
    uStack_154c = (ushort)bStack_2712;
    uStack_154a = (ushort)bStack_2711;
    uStack_1576 = (ushort)bStack_282f;
    uStack_1574 = (ushort)bStack_282e;
    uStack_1572 = (ushort)bStack_282d;
    uStack_156e = (ushort)bStack_282b;
    uStack_156c = (ushort)bStack_282a;
    uStack_156a = (ushort)bStack_2829;
    uVar20 = local_1058 + (ushort)local_2718 * local_1028 + 0x80;
    uVar27 = sStack_1056 + uStack_1556 * sStack_1026 + 0x80;
    uVar31 = sStack_1054 + uStack_1554 * sStack_1024 + 0x80;
    uVar35 = sStack_1052 + uStack_1552 * sStack_1022 + 0x80;
    uVar39 = sStack_1050 + (ushort)bStack_2714 * sStack_1020 + 0x80;
    uVar43 = sStack_104e + uStack_154e * sStack_101e + 0x80;
    uVar47 = sStack_104c + uStack_154c * sStack_101c + 0x80;
    uVar51 = sStack_104a + uStack_154a * sStack_101a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1058 + (ushort)bStack_2830 * local_1028 + 0x80;
    uVar29 = sStack_1056 + uStack_1576 * sStack_1026 + 0x80;
    uVar33 = sStack_1054 + uStack_1574 * sStack_1024 + 0x80;
    uVar37 = sStack_1052 + uStack_1572 * sStack_1022 + 0x80;
    uVar41 = sStack_1050 + (ushort)bStack_282c * sStack_1020 + 0x80;
    uVar45 = sStack_104e + uStack_156e * sStack_101e + 0x80;
    uVar49 = sStack_104c + uStack_156c * sStack_101c + 0x80;
    uVar53 = sStack_104a + uStack_156a * sStack_101a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[6] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[7] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    local_29b0 = (undefined8 *)(in_RSI + (long)local_29b0);
  }
  for (local_2c2c = 0x1000100; local_2c2c < 0xf0e0f0f; local_2c2c = local_2c2c + 0x2020202) {
    auVar10._8_7_ = 0x19001d00220027;
    auVar10._0_8_ = 0x2d0034003b0042;
    auVar10[0xf] = 0;
    auVar9._8_8_ = CONCAT44(local_2c2c,local_2c2c);
    auVar9._0_8_ = CONCAT44(local_2c2c,local_2c2c);
    auVar24 = pshufb(auVar10,auVar9);
    auVar8._2_2_ = uStack_2566 * 0xc5;
    auVar8._0_2_ = uVar19 * 0xbe;
    auVar8._4_2_ = uStack_2564 * 0xcc;
    auVar8._6_2_ = uStack_25a2 * 0xd3;
    auVar8._10_2_ = uStack_255e * 0xde;
    auVar8._8_2_ = uVar19 * 0xd9;
    auVar8._12_2_ = uStack_255c * 0xe3;
    auVar8._14_2_ = uStack_259a * 0xe7;
    auVar7._8_8_ = CONCAT44(local_2c2c,local_2c2c);
    auVar7._0_8_ = CONCAT44(local_2c2c,local_2c2c);
    auVar25 = pshufb(auVar8,auVar7);
    uStack_1716 = (ushort)bStack_2657;
    uStack_1714 = (ushort)bStack_2656;
    uStack_1712 = (ushort)bStack_2655;
    uStack_170e = (ushort)bStack_2653;
    uStack_170c = (ushort)bStack_2652;
    uStack_170a = (ushort)bStack_2651;
    local_1728 = auVar24._0_2_;
    sStack_1726 = auVar24._2_2_;
    sStack_1724 = auVar24._4_2_;
    sStack_1722 = auVar24._6_2_;
    sStack_1720 = auVar24._8_2_;
    sStack_171e = auVar24._10_2_;
    sStack_171c = auVar24._12_2_;
    sStack_171a = auVar24._14_2_;
    uStack_1736 = (ushort)bStack_27cf;
    uStack_1734 = (ushort)bStack_27ce;
    uStack_1732 = (ushort)bStack_27cd;
    uStack_172e = (ushort)bStack_27cb;
    uStack_172c = (ushort)bStack_27ca;
    uStack_172a = (ushort)bStack_27c9;
    local_1758 = auVar25._0_2_;
    sStack_1756 = auVar25._2_2_;
    sStack_1754 = auVar25._4_2_;
    sStack_1752 = auVar25._6_2_;
    sStack_1750 = auVar25._8_2_;
    sStack_174e = auVar25._10_2_;
    sStack_174c = auVar25._12_2_;
    sStack_174a = auVar25._14_2_;
    uVar20 = local_1758 + (ushort)local_2658 * local_1728 + 0x80;
    uVar27 = sStack_1756 + uStack_1716 * sStack_1726 + 0x80;
    uVar31 = sStack_1754 + uStack_1714 * sStack_1724 + 0x80;
    uVar35 = sStack_1752 + uStack_1712 * sStack_1722 + 0x80;
    uVar39 = sStack_1750 + (ushort)bStack_2654 * sStack_1720 + 0x80;
    uVar43 = sStack_174e + uStack_170e * sStack_171e + 0x80;
    uVar47 = sStack_174c + uStack_170c * sStack_171c + 0x80;
    uVar51 = sStack_174a + uStack_170a * sStack_171a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1758 + (ushort)bStack_27d0 * local_1728 + 0x80;
    uVar29 = sStack_1756 + uStack_1736 * sStack_1726 + 0x80;
    uVar33 = sStack_1754 + uStack_1734 * sStack_1724 + 0x80;
    uVar37 = sStack_1752 + uStack_1732 * sStack_1722 + 0x80;
    uVar41 = sStack_1750 + (ushort)bStack_27cc * sStack_1720 + 0x80;
    uVar45 = sStack_174e + uStack_172e * sStack_171e + 0x80;
    uVar49 = sStack_174c + uStack_172c * sStack_171c + 0x80;
    uVar53 = sStack_174a + uStack_172a * sStack_171a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    *local_29b0 = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                           CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                    (0xff < uVar48),
                                    CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8)
                                             - (0xff < uVar44),
                                             CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                      (char)(uVar39 >> 8) - (0xff < uVar40),
                                                      CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT12((uVar32 != 0) *
                                                                         (uVar32 < 0x100) *
                                                                         (char)(uVar31 >> 8) -
                                                                         (0xff < uVar32),
                                                                         CONCAT11((uVar28 != 0) *
                                                                                  (uVar28 < 0x100) *
                                                                                  (char)(uVar27 >> 8
                                                                                        ) - (0xff < 
                                                  uVar28),(uVar21 != 0) * (uVar21 < 0x100) *
                                                          (char)(uVar20 >> 8) - (0xff < uVar21))))))
                                   ));
    local_29b0[1] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_18d6 = (ushort)bStack_2697;
    uStack_18d4 = (ushort)bStack_2696;
    uStack_18d2 = (ushort)bStack_2695;
    uStack_18ce = (ushort)bStack_2693;
    uStack_18cc = (ushort)bStack_2692;
    uStack_18ca = (ushort)bStack_2691;
    uStack_18f6 = (ushort)bStack_27ef;
    uStack_18f4 = (ushort)bStack_27ee;
    uStack_18f2 = (ushort)bStack_27ed;
    uStack_18ee = (ushort)bStack_27eb;
    uStack_18ec = (ushort)bStack_27ea;
    uStack_18ea = (ushort)bStack_27e9;
    uVar20 = local_1758 + (ushort)local_2698 * local_1728 + 0x80;
    uVar27 = sStack_1756 + uStack_18d6 * sStack_1726 + 0x80;
    uVar31 = sStack_1754 + uStack_18d4 * sStack_1724 + 0x80;
    uVar35 = sStack_1752 + uStack_18d2 * sStack_1722 + 0x80;
    uVar39 = sStack_1750 + (ushort)bStack_2694 * sStack_1720 + 0x80;
    uVar43 = sStack_174e + uStack_18ce * sStack_171e + 0x80;
    uVar47 = sStack_174c + uStack_18cc * sStack_171c + 0x80;
    uVar51 = sStack_174a + uStack_18ca * sStack_171a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1758 + (ushort)bStack_27f0 * local_1728 + 0x80;
    uVar29 = sStack_1756 + uStack_18f6 * sStack_1726 + 0x80;
    uVar33 = sStack_1754 + uStack_18f4 * sStack_1724 + 0x80;
    uVar37 = sStack_1752 + uStack_18f2 * sStack_1722 + 0x80;
    uVar41 = sStack_1750 + (ushort)bStack_27ec * sStack_1720 + 0x80;
    uVar45 = sStack_174e + uStack_18ee * sStack_171e + 0x80;
    uVar49 = sStack_174c + uStack_18ec * sStack_171c + 0x80;
    uVar53 = sStack_174a + uStack_18ea * sStack_171a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[2] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[3] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_1a96 = (ushort)bStack_26d7;
    uStack_1a94 = (ushort)bStack_26d6;
    uStack_1a92 = (ushort)bStack_26d5;
    uStack_1a8e = (ushort)bStack_26d3;
    uStack_1a8c = (ushort)bStack_26d2;
    uStack_1a8a = (ushort)bStack_26d1;
    uStack_1ab6 = (ushort)bStack_280f;
    uStack_1ab4 = (ushort)bStack_280e;
    uStack_1ab2 = (ushort)bStack_280d;
    uStack_1aae = (ushort)bStack_280b;
    uStack_1aac = (ushort)bStack_280a;
    uStack_1aaa = (ushort)bStack_2809;
    uVar20 = local_1758 + (ushort)local_26d8 * local_1728 + 0x80;
    uVar27 = sStack_1756 + uStack_1a96 * sStack_1726 + 0x80;
    uVar31 = sStack_1754 + uStack_1a94 * sStack_1724 + 0x80;
    uVar35 = sStack_1752 + uStack_1a92 * sStack_1722 + 0x80;
    uVar39 = sStack_1750 + (ushort)bStack_26d4 * sStack_1720 + 0x80;
    uVar43 = sStack_174e + uStack_1a8e * sStack_171e + 0x80;
    uVar47 = sStack_174c + uStack_1a8c * sStack_171c + 0x80;
    uVar51 = sStack_174a + uStack_1a8a * sStack_171a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1758 + (ushort)bStack_2810 * local_1728 + 0x80;
    uVar29 = sStack_1756 + uStack_1ab6 * sStack_1726 + 0x80;
    uVar33 = sStack_1754 + uStack_1ab4 * sStack_1724 + 0x80;
    uVar37 = sStack_1752 + uStack_1ab2 * sStack_1722 + 0x80;
    uVar41 = sStack_1750 + (ushort)bStack_280c * sStack_1720 + 0x80;
    uVar45 = sStack_174e + uStack_1aae * sStack_171e + 0x80;
    uVar49 = sStack_174c + uStack_1aac * sStack_171c + 0x80;
    uVar53 = sStack_174a + uStack_1aaa * sStack_171a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[4] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[5] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_1c56 = (ushort)bStack_2717;
    uStack_1c54 = (ushort)bStack_2716;
    uStack_1c52 = (ushort)bStack_2715;
    uStack_1c4e = (ushort)bStack_2713;
    uStack_1c4c = (ushort)bStack_2712;
    uStack_1c4a = (ushort)bStack_2711;
    uStack_1c76 = (ushort)bStack_282f;
    uStack_1c74 = (ushort)bStack_282e;
    uStack_1c72 = (ushort)bStack_282d;
    uStack_1c6e = (ushort)bStack_282b;
    uStack_1c6c = (ushort)bStack_282a;
    uStack_1c6a = (ushort)bStack_2829;
    uVar20 = local_1758 + (ushort)local_2718 * local_1728 + 0x80;
    uVar27 = sStack_1756 + uStack_1c56 * sStack_1726 + 0x80;
    uVar31 = sStack_1754 + uStack_1c54 * sStack_1724 + 0x80;
    uVar35 = sStack_1752 + uStack_1c52 * sStack_1722 + 0x80;
    uVar39 = sStack_1750 + (ushort)bStack_2714 * sStack_1720 + 0x80;
    uVar43 = sStack_174e + uStack_1c4e * sStack_171e + 0x80;
    uVar47 = sStack_174c + uStack_1c4c * sStack_171c + 0x80;
    uVar51 = sStack_174a + uStack_1c4a * sStack_171a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1758 + (ushort)bStack_2830 * local_1728 + 0x80;
    uVar29 = sStack_1756 + uStack_1c76 * sStack_1726 + 0x80;
    uVar33 = sStack_1754 + uStack_1c74 * sStack_1724 + 0x80;
    uVar37 = sStack_1752 + uStack_1c72 * sStack_1722 + 0x80;
    uVar41 = sStack_1750 + (ushort)bStack_282c * sStack_1720 + 0x80;
    uVar45 = sStack_174e + uStack_1c6e * sStack_171e + 0x80;
    uVar49 = sStack_174c + uStack_1c6c * sStack_171c + 0x80;
    uVar53 = sStack_174a + uStack_1c6a * sStack_171a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[6] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[7] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    local_29b0 = (undefined8 *)(in_RSI + (long)local_29b0);
  }
  for (local_2c6c = 0x1000100; local_2c6c < 0xf0e0f0f; local_2c6c = local_2c6c + 0x2020202) {
    auVar6._8_7_ = 0x800080009000a;
    auVar6._0_8_ = 0xc000e00110015;
    auVar6[0xf] = 0;
    auVar26._8_8_ = CONCAT44(local_2c6c,local_2c6c);
    auVar26._0_8_ = CONCAT44(local_2c6c,local_2c6c);
    auVar26 = pshufb(auVar6,auVar26);
    auVar25._2_2_ = uStack_2566 * 0xef;
    auVar25._0_2_ = uVar19 * 0xeb;
    auVar25._4_2_ = uStack_2564 * 0xf2;
    auVar25._6_2_ = uStack_25c2 * 0xf4;
    auVar25._10_2_ = uStack_255e * 0xf7;
    auVar25._8_2_ = uVar19 * 0xf6;
    auVar25._12_2_ = uStack_255c * 0xf8;
    auVar25._14_2_ = uStack_25ba * 0xf8;
    auVar24._8_8_ = CONCAT44(local_2c6c,local_2c6c);
    auVar24._0_8_ = CONCAT44(local_2c6c,local_2c6c);
    auVar24 = pshufb(auVar25,auVar24);
    uStack_1e16 = (ushort)bStack_2657;
    uStack_1e14 = (ushort)bStack_2656;
    uStack_1e12 = (ushort)bStack_2655;
    uStack_1e0e = (ushort)bStack_2653;
    uStack_1e0c = (ushort)bStack_2652;
    uStack_1e0a = (ushort)bStack_2651;
    local_1e28 = auVar26._0_2_;
    sStack_1e26 = auVar26._2_2_;
    sStack_1e24 = auVar26._4_2_;
    sStack_1e22 = auVar26._6_2_;
    sStack_1e20 = auVar26._8_2_;
    sStack_1e1e = auVar26._10_2_;
    sStack_1e1c = auVar26._12_2_;
    sStack_1e1a = auVar26._14_2_;
    uStack_1e36 = (ushort)bStack_27cf;
    uStack_1e34 = (ushort)bStack_27ce;
    uStack_1e32 = (ushort)bStack_27cd;
    uStack_1e2e = (ushort)bStack_27cb;
    uStack_1e2c = (ushort)bStack_27ca;
    uStack_1e2a = (ushort)bStack_27c9;
    local_1e58 = auVar24._0_2_;
    sStack_1e56 = auVar24._2_2_;
    sStack_1e54 = auVar24._4_2_;
    sStack_1e52 = auVar24._6_2_;
    sStack_1e50 = auVar24._8_2_;
    sStack_1e4e = auVar24._10_2_;
    sStack_1e4c = auVar24._12_2_;
    sStack_1e4a = auVar24._14_2_;
    uVar20 = local_1e58 + (ushort)local_2658 * local_1e28 + 0x80;
    uVar27 = sStack_1e56 + uStack_1e16 * sStack_1e26 + 0x80;
    uVar31 = sStack_1e54 + uStack_1e14 * sStack_1e24 + 0x80;
    uVar35 = sStack_1e52 + uStack_1e12 * sStack_1e22 + 0x80;
    uVar39 = sStack_1e50 + (ushort)bStack_2654 * sStack_1e20 + 0x80;
    uVar43 = sStack_1e4e + uStack_1e0e * sStack_1e1e + 0x80;
    uVar47 = sStack_1e4c + uStack_1e0c * sStack_1e1c + 0x80;
    uVar51 = sStack_1e4a + uStack_1e0a * sStack_1e1a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1e58 + (ushort)bStack_27d0 * local_1e28 + 0x80;
    uVar29 = sStack_1e56 + uStack_1e36 * sStack_1e26 + 0x80;
    uVar33 = sStack_1e54 + uStack_1e34 * sStack_1e24 + 0x80;
    uVar37 = sStack_1e52 + uStack_1e32 * sStack_1e22 + 0x80;
    uVar41 = sStack_1e50 + (ushort)bStack_27cc * sStack_1e20 + 0x80;
    uVar45 = sStack_1e4e + uStack_1e2e * sStack_1e1e + 0x80;
    uVar49 = sStack_1e4c + uStack_1e2c * sStack_1e1c + 0x80;
    uVar53 = sStack_1e4a + uStack_1e2a * sStack_1e1a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    *local_29b0 = CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                           CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) -
                                    (0xff < uVar48),
                                    CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8)
                                             - (0xff < uVar44),
                                             CONCAT14((uVar40 != 0) * (uVar40 < 0x100) *
                                                      (char)(uVar39 >> 8) - (0xff < uVar40),
                                                      CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                               (char)(uVar35 >> 8) - (0xff < uVar36)
                                                               ,CONCAT12((uVar32 != 0) *
                                                                         (uVar32 < 0x100) *
                                                                         (char)(uVar31 >> 8) -
                                                                         (0xff < uVar32),
                                                                         CONCAT11((uVar28 != 0) *
                                                                                  (uVar28 < 0x100) *
                                                                                  (char)(uVar27 >> 8
                                                                                        ) - (0xff < 
                                                  uVar28),(uVar21 != 0) * (uVar21 < 0x100) *
                                                          (char)(uVar20 >> 8) - (0xff < uVar21))))))
                                   ));
    local_29b0[1] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_1fd6 = (ushort)bStack_2697;
    uStack_1fd4 = (ushort)bStack_2696;
    uStack_1fd2 = (ushort)bStack_2695;
    uStack_1fce = (ushort)bStack_2693;
    uStack_1fcc = (ushort)bStack_2692;
    uStack_1fca = (ushort)bStack_2691;
    uStack_1ff6 = (ushort)bStack_27ef;
    uStack_1ff4 = (ushort)bStack_27ee;
    uStack_1ff2 = (ushort)bStack_27ed;
    uStack_1fee = (ushort)bStack_27eb;
    uStack_1fec = (ushort)bStack_27ea;
    uStack_1fea = (ushort)bStack_27e9;
    uVar20 = local_1e58 + (ushort)local_2698 * local_1e28 + 0x80;
    uVar27 = sStack_1e56 + uStack_1fd6 * sStack_1e26 + 0x80;
    uVar31 = sStack_1e54 + uStack_1fd4 * sStack_1e24 + 0x80;
    uVar35 = sStack_1e52 + uStack_1fd2 * sStack_1e22 + 0x80;
    uVar39 = sStack_1e50 + (ushort)bStack_2694 * sStack_1e20 + 0x80;
    uVar43 = sStack_1e4e + uStack_1fce * sStack_1e1e + 0x80;
    uVar47 = sStack_1e4c + uStack_1fcc * sStack_1e1c + 0x80;
    uVar51 = sStack_1e4a + uStack_1fca * sStack_1e1a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1e58 + (ushort)bStack_27f0 * local_1e28 + 0x80;
    uVar29 = sStack_1e56 + uStack_1ff6 * sStack_1e26 + 0x80;
    uVar33 = sStack_1e54 + uStack_1ff4 * sStack_1e24 + 0x80;
    uVar37 = sStack_1e52 + uStack_1ff2 * sStack_1e22 + 0x80;
    uVar41 = sStack_1e50 + (ushort)bStack_27ec * sStack_1e20 + 0x80;
    uVar45 = sStack_1e4e + uStack_1fee * sStack_1e1e + 0x80;
    uVar49 = sStack_1e4c + uStack_1fec * sStack_1e1c + 0x80;
    uVar53 = sStack_1e4a + uStack_1fea * sStack_1e1a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[2] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[3] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_2196 = (ushort)bStack_26d7;
    uStack_2194 = (ushort)bStack_26d6;
    uStack_2192 = (ushort)bStack_26d5;
    uStack_218e = (ushort)bStack_26d3;
    uStack_218c = (ushort)bStack_26d2;
    uStack_218a = (ushort)bStack_26d1;
    uStack_21b6 = (ushort)bStack_280f;
    uStack_21b4 = (ushort)bStack_280e;
    uStack_21b2 = (ushort)bStack_280d;
    uStack_21ae = (ushort)bStack_280b;
    uStack_21ac = (ushort)bStack_280a;
    uStack_21aa = (ushort)bStack_2809;
    uVar20 = local_1e58 + (ushort)local_26d8 * local_1e28 + 0x80;
    uVar27 = sStack_1e56 + uStack_2196 * sStack_1e26 + 0x80;
    uVar31 = sStack_1e54 + uStack_2194 * sStack_1e24 + 0x80;
    uVar35 = sStack_1e52 + uStack_2192 * sStack_1e22 + 0x80;
    uVar39 = sStack_1e50 + (ushort)bStack_26d4 * sStack_1e20 + 0x80;
    uVar43 = sStack_1e4e + uStack_218e * sStack_1e1e + 0x80;
    uVar47 = sStack_1e4c + uStack_218c * sStack_1e1c + 0x80;
    uVar51 = sStack_1e4a + uStack_218a * sStack_1e1a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1e58 + (ushort)bStack_2810 * local_1e28 + 0x80;
    uVar29 = sStack_1e56 + uStack_21b6 * sStack_1e26 + 0x80;
    uVar33 = sStack_1e54 + uStack_21b4 * sStack_1e24 + 0x80;
    uVar37 = sStack_1e52 + uStack_21b2 * sStack_1e22 + 0x80;
    uVar41 = sStack_1e50 + (ushort)bStack_280c * sStack_1e20 + 0x80;
    uVar45 = sStack_1e4e + uStack_21ae * sStack_1e1e + 0x80;
    uVar49 = sStack_1e4c + uStack_21ac * sStack_1e1c + 0x80;
    uVar53 = sStack_1e4a + uStack_21aa * sStack_1e1a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[4] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[5] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    uStack_2356 = (ushort)bStack_2717;
    uStack_2354 = (ushort)bStack_2716;
    uStack_2352 = (ushort)bStack_2715;
    uStack_234e = (ushort)bStack_2713;
    uStack_234c = (ushort)bStack_2712;
    uStack_234a = (ushort)bStack_2711;
    uStack_2376 = (ushort)bStack_282f;
    uStack_2374 = (ushort)bStack_282e;
    uStack_2372 = (ushort)bStack_282d;
    uStack_236e = (ushort)bStack_282b;
    uStack_236c = (ushort)bStack_282a;
    uStack_236a = (ushort)bStack_2829;
    uVar20 = local_1e58 + (ushort)local_2718 * local_1e28 + 0x80;
    uVar27 = sStack_1e56 + uStack_2356 * sStack_1e26 + 0x80;
    uVar31 = sStack_1e54 + uStack_2354 * sStack_1e24 + 0x80;
    uVar35 = sStack_1e52 + uStack_2352 * sStack_1e22 + 0x80;
    uVar39 = sStack_1e50 + (ushort)bStack_2714 * sStack_1e20 + 0x80;
    uVar43 = sStack_1e4e + uStack_234e * sStack_1e1e + 0x80;
    uVar47 = sStack_1e4c + uStack_234c * sStack_1e1c + 0x80;
    uVar51 = sStack_1e4a + uStack_234a * sStack_1e1a + 0x80;
    uVar21 = uVar20 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar48 = uVar47 >> 8;
    uVar52 = uVar51 >> 8;
    uVar22 = local_1e58 + (ushort)bStack_2830 * local_1e28 + 0x80;
    uVar29 = sStack_1e56 + uStack_2376 * sStack_1e26 + 0x80;
    uVar33 = sStack_1e54 + uStack_2374 * sStack_1e24 + 0x80;
    uVar37 = sStack_1e52 + uStack_2372 * sStack_1e22 + 0x80;
    uVar41 = sStack_1e50 + (ushort)bStack_282c * sStack_1e20 + 0x80;
    uVar45 = sStack_1e4e + uStack_236e * sStack_1e1e + 0x80;
    uVar49 = sStack_1e4c + uStack_236c * sStack_1e1c + 0x80;
    uVar53 = sStack_1e4a + uStack_236a * sStack_1e1a + 0x80;
    uVar23 = uVar22 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    uVar50 = uVar49 >> 8;
    uVar54 = uVar53 >> 8;
    local_29b0[6] =
         CONCAT17((uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52),
                  CONCAT16((uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48),
                           CONCAT15((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                                    (0xff < uVar44),
                                    CONCAT14((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8)
                                             - (0xff < uVar40),
                                             CONCAT13((uVar36 != 0) * (uVar36 < 0x100) *
                                                      (char)(uVar35 >> 8) - (0xff < uVar36),
                                                      CONCAT12((uVar32 != 0) * (uVar32 < 0x100) *
                                                               (char)(uVar31 >> 8) - (0xff < uVar32)
                                                               ,CONCAT11((uVar28 != 0) *
                                                                         (uVar28 < 0x100) *
                                                                         (char)(uVar27 >> 8) -
                                                                         (0xff < uVar28),
                                                                         (uVar21 != 0) *
                                                                         (uVar21 < 0x100) *
                                                                         (char)(uVar20 >> 8) -
                                                                         (0xff < uVar21))))))));
    local_29b0[7] =
         CONCAT17((uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54),
                  CONCAT16((uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50),
                           CONCAT15((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                                    (0xff < uVar46),
                                    CONCAT14((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8)
                                             - (0xff < uVar42),
                                             CONCAT13((uVar38 != 0) * (uVar38 < 0x100) *
                                                      (char)(uVar37 >> 8) - (0xff < uVar38),
                                                      CONCAT12((uVar34 != 0) * (uVar34 < 0x100) *
                                                               (char)(uVar33 >> 8) - (0xff < uVar34)
                                                               ,CONCAT11((uVar30 != 0) *
                                                                         (uVar30 < 0x100) *
                                                                         (char)(uVar29 >> 8) -
                                                                         (0xff < uVar30),
                                                                         (uVar23 != 0) *
                                                                         (uVar23 < 0x100) *
                                                                         (char)(uVar22 >> 8) -
                                                                         (0xff < uVar23))))))));
    local_29b0 = (undefined8 *)(in_RSI + (long)local_29b0);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_64x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i top_lolo = LoadUnaligned16(top_row);
  const __m128i top_lohi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lolo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lolo, zero);
  const __m128i top3 = cvtepu8_epi16(top_lohi);
  const __m128i top4 = _mm_unpackhi_epi8(top_lohi, zero);
  const __m128i top_hilo = LoadUnaligned16(top_row + 32);
  const __m128i top_hihi = LoadUnaligned16(top_row + 48);
  const __m128i top5 = cvtepu8_epi16(top_hilo);
  const __m128i top6 = _mm_unpackhi_epi8(top_hilo, zero);
  const __m128i top7 = cvtepu8_epi16(top_hihi);
  const __m128i top8 = _mm_unpackhi_epi8(top_hihi, zero);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));

  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}